

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O0

char * Fantasy_Movie_parse_json_table
                 (flatcc_json_parser_t *ctx,char *buf,char *end,flatcc_builder_ref_t *result)

{
  flatcc_builder_ref_t *pfVar1;
  int iVar2;
  flatcc_builder_ref_t fVar3;
  flatcc_builder_ref_t *pfVar4;
  char *pcVar5;
  size_t local_68;
  size_t h_unions;
  uint64_t w;
  char *mark;
  flatcc_builder_ref_t *pref;
  flatcc_builder_ref_t ref;
  void *pval;
  flatcc_builder_ref_t *pfStack_30;
  int more;
  flatcc_builder_ref_t *result_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  *result = 0;
  pfStack_30 = result;
  result_local = (flatcc_builder_ref_t *)end;
  end_local = buf;
  buf_local = (char *)ctx;
  iVar2 = flatcc_builder_start_table(ctx->ctx,10);
  pfVar1 = result_local;
  if ((iVar2 == 0) &&
     (pfVar4 = (flatcc_builder_ref_t *)
               flatcc_json_parser_prepare_unions
                         ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,5,
                          &local_68), pfVar1 != pfVar4)) {
    end_local = flatcc_json_parser_object_start
                          ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                           (int *)((long)&pval + 4));
    while (pval._4_4_ != 0) {
      end_local = flatcc_json_parser_symbol_start
                            ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local);
      h_unions = flatcc_json_parser_symbol_part(end_local,(char *)result_local);
      if (h_unions < 0x6368617261637465) {
        if (h_unions == 0x616e7461676f6e69) {
          end_local = end_local + 8;
          h_unions = flatcc_json_parser_symbol_part(end_local,(char *)result_local);
          if ((h_unions & 0xffffffffffffff00) == 0x73745f7479706500) {
            w = (uint64_t)end_local;
            end_local = flatcc_json_parser_match_symbol
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                                   7);
            if ((char *)w == end_local) {
              end_local = flatcc_json_parser_unmatched_symbol
                                    ((flatcc_json_parser_t *)buf_local,end_local,
                                     (char *)result_local);
            }
            else {
              end_local = flatcc_json_parser_union_type
                                    ((flatcc_json_parser_t *)buf_local,end_local,
                                     (char *)result_local,1,3,local_68,
                                     Fantasy_Movie_parse_json_table::symbolic_parsers,
                                     Fantasy_Character_parse_json_union);
            }
          }
          else if ((h_unions & 0xffff000000000000) == 0x7374000000000000) {
            w = (uint64_t)end_local;
            end_local = flatcc_json_parser_match_symbol
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                                   2);
            if ((char *)w == end_local) {
              end_local = flatcc_json_parser_unmatched_symbol
                                    ((flatcc_json_parser_t *)buf_local,end_local,
                                     (char *)result_local);
            }
            else {
              end_local = flatcc_json_parser_union
                                    ((flatcc_json_parser_t *)buf_local,end_local,
                                     (char *)result_local,1,3,local_68,
                                     Fantasy_Character_parse_json_union);
            }
          }
          else {
            end_local = flatcc_json_parser_unmatched_symbol
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local)
            ;
          }
        }
        else if (h_unions == 0x63616d656f5f7479) {
          end_local = end_local + 8;
          h_unions = flatcc_json_parser_symbol_part(end_local,(char *)result_local);
          if ((h_unions & 0xffff000000000000) == 0x7065000000000000) {
            w = (uint64_t)end_local;
            end_local = flatcc_json_parser_match_symbol
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                                   2);
            if ((char *)w == end_local) {
              end_local = flatcc_json_parser_unmatched_symbol
                                    ((flatcc_json_parser_t *)buf_local,end_local,
                                     (char *)result_local);
            }
            else {
              end_local = flatcc_json_parser_union_type
                                    ((flatcc_json_parser_t *)buf_local,end_local,
                                     (char *)result_local,3,7,local_68,
                                     Fantasy_Movie_parse_json_table::symbolic_parsers_1,
                                     Fantasy_Character_parse_json_union);
            }
          }
          else {
            end_local = flatcc_json_parser_unmatched_symbol
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local)
            ;
          }
        }
        else if ((h_unions & 0xffffffffff000000) == 0x63616d656f000000) {
          w = (uint64_t)end_local;
          end_local = flatcc_json_parser_match_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,5)
          ;
          if ((char *)w == end_local) {
            end_local = flatcc_json_parser_unmatched_symbol
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local)
            ;
          }
          else {
            end_local = flatcc_json_parser_union
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                                   3,7,local_68,Fantasy_Character_parse_json_union);
          }
        }
        else {
          end_local = flatcc_json_parser_unmatched_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local);
        }
      }
      else if (h_unions < 0x6d61696e5f636861) {
        if (h_unions == 0x6368617261637465) {
          end_local = end_local + 8;
          h_unions = flatcc_json_parser_symbol_part(end_local,(char *)result_local);
          if ((h_unions & 0xffffffffffffff00) == 0x72735f7479706500) {
            w = (uint64_t)end_local;
            end_local = flatcc_json_parser_match_symbol
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                                   7);
            if ((char *)w == end_local) {
              end_local = flatcc_json_parser_unmatched_symbol
                                    ((flatcc_json_parser_t *)buf_local,end_local,
                                     (char *)result_local);
            }
            else {
              end_local = flatcc_json_parser_union_type_vector
                                    ((flatcc_json_parser_t *)buf_local,end_local,
                                     (char *)result_local,4,9,local_68,
                                     Fantasy_Movie_parse_json_table::symbolic_parsers_2,
                                     Fantasy_Character_parse_json_union,
                                     Fantasy_Character_json_union_accept_type);
            }
          }
          else if ((h_unions & 0xffff000000000000) == 0x7273000000000000) {
            w = (uint64_t)end_local;
            end_local = flatcc_json_parser_match_symbol
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                                   2);
            if ((char *)w == end_local) {
              end_local = flatcc_json_parser_unmatched_symbol
                                    ((flatcc_json_parser_t *)buf_local,end_local,
                                     (char *)result_local);
            }
            else {
              end_local = flatcc_json_parser_union_vector
                                    ((flatcc_json_parser_t *)buf_local,end_local,
                                     (char *)result_local,4,9,local_68,
                                     Fantasy_Character_parse_json_union);
            }
          }
          else {
            end_local = flatcc_json_parser_unmatched_symbol
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local)
            ;
          }
        }
        else {
          end_local = flatcc_json_parser_unmatched_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local);
        }
      }
      else if (h_unions == 0x6d61696e5f636861) {
        end_local = end_local + 8;
        h_unions = flatcc_json_parser_symbol_part(end_local,(char *)result_local);
        if (h_unions == 0x7261637465725f74) {
          end_local = end_local + 8;
          h_unions = flatcc_json_parser_symbol_part(end_local,(char *)result_local);
          if ((h_unions & 0xffffff0000000000) == 0x7970650000000000) {
            w = (uint64_t)end_local;
            end_local = flatcc_json_parser_match_symbol
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                                   3);
            if ((char *)w == end_local) {
              end_local = flatcc_json_parser_unmatched_symbol
                                    ((flatcc_json_parser_t *)buf_local,end_local,
                                     (char *)result_local);
            }
            else {
              end_local = flatcc_json_parser_union_type
                                    ((flatcc_json_parser_t *)buf_local,end_local,
                                     (char *)result_local,0,1,local_68,
                                     Fantasy_Movie_parse_json_table::symbolic_parsers_3,
                                     Fantasy_Character_parse_json_union);
            }
          }
          else {
            end_local = flatcc_json_parser_unmatched_symbol
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local)
            ;
          }
        }
        else if ((h_unions & 0xffffffffffff0000) == 0x7261637465720000) {
          w = (uint64_t)end_local;
          end_local = flatcc_json_parser_match_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,6)
          ;
          if ((char *)w == end_local) {
            end_local = flatcc_json_parser_unmatched_symbol
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local)
            ;
          }
          else {
            end_local = flatcc_json_parser_union
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                                   0,1,local_68,Fantasy_Character_parse_json_union);
          }
        }
        else {
          end_local = flatcc_json_parser_unmatched_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local);
        }
      }
      else if (h_unions == 0x736964655f6b6963) {
        end_local = end_local + 8;
        h_unions = flatcc_json_parser_symbol_part(end_local,(char *)result_local);
        if ((h_unions & 0xffffffffffff0000) == 0x6b5f747970650000) {
          w = (uint64_t)end_local;
          end_local = flatcc_json_parser_match_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,6)
          ;
          if ((char *)w == end_local) {
            end_local = flatcc_json_parser_unmatched_symbol
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local)
            ;
          }
          else {
            end_local = flatcc_json_parser_union_type
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                                   2,5,local_68,Fantasy_Movie_parse_json_table::symbolic_parsers_4,
                                   Fantasy_Character_parse_json_union);
          }
        }
        else if ((h_unions & 0xff00000000000000) == 0x6b00000000000000) {
          w = (uint64_t)end_local;
          end_local = flatcc_json_parser_match_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,1)
          ;
          if ((char *)w == end_local) {
            end_local = flatcc_json_parser_unmatched_symbol
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local)
            ;
          }
          else {
            end_local = flatcc_json_parser_union
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                                   2,5,local_68,Fantasy_Character_parse_json_union);
          }
        }
        else {
          end_local = flatcc_json_parser_unmatched_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local);
        }
      }
      else {
        end_local = flatcc_json_parser_unmatched_symbol
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local);
      }
      end_local = flatcc_json_parser_object_end
                            ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                             (int *)((long)&pval + 4));
    }
    if (*(int *)(buf_local + 0x20) == 0) {
      end_local = flatcc_json_parser_finalize_unions
                            ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                             local_68);
      fVar3 = flatcc_builder_end_table(*(flatcc_builder_t **)buf_local);
      *pfStack_30 = fVar3;
      if (fVar3 != 0) {
        return end_local;
      }
    }
  }
  pcVar5 = flatcc_json_parser_set_error
                     ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,0x23);
  return pcVar5;
}

Assistant:

static const char *Fantasy_Movie_parse_json_table(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result)
{
    int more;
    void *pval;
    flatcc_builder_ref_t ref, *pref;
    const char *mark;
    uint64_t w;
    size_t h_unions;

    *result = 0;
    if (flatcc_builder_start_table(ctx->ctx, 10)) goto failed;
    if (end == flatcc_json_parser_prepare_unions(ctx, buf, end, 5, &h_unions)) goto failed;
    buf = flatcc_json_parser_object_start(ctx, buf, end, &more);
    while (more) {
        buf = flatcc_json_parser_symbol_start(ctx, buf, end);
        w = flatcc_json_parser_symbol_part(buf, end);
        if (w < 0x6368617261637465) { /* branch "characte" */
            if (w == 0x616e7461676f6e69) { /* descend "antagoni" */
                buf += 8;
                w = flatcc_json_parser_symbol_part(buf, end);
                if ((w & 0xffffffffffffff00) == 0x73745f7479706500) { /* "st_type" */
                    buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 7);
                    if (mark != buf) {
                        static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                Fantasy_Character_parse_json_enum,
                                monster_test_local_Fantasy_json_parser_enum,
                                monster_test_global_json_parser_enum, 0 };
                        buf = flatcc_json_parser_union_type(ctx, buf, end, 1, 3, h_unions, symbolic_parsers, Fantasy_Character_parse_json_union);
                    } else {
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    }
                } else { /* "st_type" */
                    if ((w & 0xffff000000000000) == 0x7374000000000000) { /* "st" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 2);
                        if (mark != buf) {
                            buf = flatcc_json_parser_union(ctx, buf, end, 1, 3, h_unions, Fantasy_Character_parse_json_union);
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "st" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "st" */
                } /* "st_type" */
            } else { /* descend "antagoni" */
                if (w == 0x63616d656f5f7479) { /* descend "cameo_ty" */
                    buf += 8;
                    w = flatcc_json_parser_symbol_part(buf, end);
                    if ((w & 0xffff000000000000) == 0x7065000000000000) { /* "pe" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 2);
                        if (mark != buf) {
                            static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                    Fantasy_Character_parse_json_enum,
                                    monster_test_local_Fantasy_json_parser_enum,
                                    monster_test_global_json_parser_enum, 0 };
                            buf = flatcc_json_parser_union_type(ctx, buf, end, 3, 7, h_unions, symbolic_parsers, Fantasy_Character_parse_json_union);
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "pe" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "pe" */
                } else { /* descend "cameo_ty" */
                    if ((w & 0xffffffffff000000) == 0x63616d656f000000) { /* "cameo" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 5);
                        if (mark != buf) {
                            buf = flatcc_json_parser_union(ctx, buf, end, 3, 7, h_unions, Fantasy_Character_parse_json_union);
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "cameo" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "cameo" */
                } /* descend "cameo_ty" */
            } /* descend "antagoni" */
        } else { /* branch "characte" */
            if (w < 0x6d61696e5f636861) { /* branch "main_cha" */
                if (w == 0x6368617261637465) { /* descend "characte" */
                    buf += 8;
                    w = flatcc_json_parser_symbol_part(buf, end);
                    if ((w & 0xffffffffffffff00) == 0x72735f7479706500) { /* "rs_type" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 7);
                        if (mark != buf) {
                            static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                    Fantasy_Character_parse_json_enum,
                                    monster_test_local_Fantasy_json_parser_enum,
                                    monster_test_global_json_parser_enum, 0 };
                            buf = flatcc_json_parser_union_type_vector(ctx, buf, end, 4, 9, h_unions, symbolic_parsers, Fantasy_Character_parse_json_union, Fantasy_Character_json_union_accept_type);
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "rs_type" */
                        if ((w & 0xffff000000000000) == 0x7273000000000000) { /* "rs" */
                            buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 2);
                            if (mark != buf) {
                                buf = flatcc_json_parser_union_vector(ctx, buf, end, 4, 9, h_unions, Fantasy_Character_parse_json_union);
                            } else {
                                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                            }
                        } else { /* "rs" */
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        } /* "rs" */
                    } /* "rs_type" */
                } else { /* descend "characte" */
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                } /* descend "characte" */
            } else { /* branch "main_cha" */
                if (w == 0x6d61696e5f636861) { /* descend "main_cha" */
                    buf += 8;
                    w = flatcc_json_parser_symbol_part(buf, end);
                    if (w == 0x7261637465725f74) { /* descend "racter_t" */
                        buf += 8;
                        w = flatcc_json_parser_symbol_part(buf, end);
                        if ((w & 0xffffff0000000000) == 0x7970650000000000) { /* "ype" */
                            buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 3);
                            if (mark != buf) {
                                static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                        Fantasy_Character_parse_json_enum,
                                        monster_test_local_Fantasy_json_parser_enum,
                                        monster_test_global_json_parser_enum, 0 };
                                buf = flatcc_json_parser_union_type(ctx, buf, end, 0, 1, h_unions, symbolic_parsers, Fantasy_Character_parse_json_union);
                            } else {
                                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                            }
                        } else { /* "ype" */
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        } /* "ype" */
                    } else { /* descend "racter_t" */
                        if ((w & 0xffffffffffff0000) == 0x7261637465720000) { /* "racter" */
                            buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 6);
                            if (mark != buf) {
                                buf = flatcc_json_parser_union(ctx, buf, end, 0, 1, h_unions, Fantasy_Character_parse_json_union);
                            } else {
                                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                            }
                        } else { /* "racter" */
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        } /* "racter" */
                    } /* descend "racter_t" */
                } else { /* descend "main_cha" */
                    if (w == 0x736964655f6b6963) { /* descend "side_kic" */
                        buf += 8;
                        w = flatcc_json_parser_symbol_part(buf, end);
                        if ((w & 0xffffffffffff0000) == 0x6b5f747970650000) { /* "k_type" */
                            buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 6);
                            if (mark != buf) {
                                static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                        Fantasy_Character_parse_json_enum,
                                        monster_test_local_Fantasy_json_parser_enum,
                                        monster_test_global_json_parser_enum, 0 };
                                buf = flatcc_json_parser_union_type(ctx, buf, end, 2, 5, h_unions, symbolic_parsers, Fantasy_Character_parse_json_union);
                            } else {
                                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                            }
                        } else { /* "k_type" */
                            if ((w & 0xff00000000000000) == 0x6b00000000000000) { /* "k" */
                                buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 1);
                                if (mark != buf) {
                                    buf = flatcc_json_parser_union(ctx, buf, end, 2, 5, h_unions, Fantasy_Character_parse_json_union);
                                } else {
                                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                                }
                            } else { /* "k" */
                                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                            } /* "k" */
                        } /* "k_type" */
                    } else { /* descend "side_kic" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* descend "side_kic" */
                } /* descend "main_cha" */
            } /* branch "main_cha" */
        } /* branch "characte" */
        buf = flatcc_json_parser_object_end(ctx, buf, end, &more);
    }
    if (ctx->error) goto failed;
    buf = flatcc_json_parser_finalize_unions(ctx, buf, end, h_unions);
    if (!(*result = flatcc_builder_end_table(ctx->ctx))) goto failed;
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}